

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::ArgumentMismatch::ArgumentMismatch
          (ArgumentMismatch *this,string *name,int expected,size_t recieved)

{
  string local_1f0;
  byte local_1cd;
  byte local_1cc;
  byte local_1cb;
  byte local_1ca;
  byte local_1c9;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  byte local_121;
  string local_120;
  byte local_100;
  byte local_ff;
  byte local_fe;
  byte local_fd;
  byte local_e9;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_t local_28;
  size_t recieved_local;
  string *psStack_18;
  int expected_local;
  string *name_local;
  ArgumentMismatch *this_local;
  
  local_e9 = 0;
  local_fd = 0;
  local_fe = 0;
  local_ff = 0;
  local_100 = 0;
  local_121 = 0;
  local_1c9 = 0;
  local_1ca = 0;
  local_1cb = 0;
  local_1cc = 0;
  local_1cd = 0;
  local_28 = recieved;
  recieved_local._4_4_ = expected;
  psStack_18 = name;
  name_local = (string *)this;
  if (expected < 1) {
    std::__cxx11::to_string(&local_1c8,-expected);
    local_1c9 = 1;
    ::std::operator+(&local_1a8,"Expected at least ",&local_1c8);
    local_1ca = 1;
    ::std::operator+(&local_188,&local_1a8," arguments to ");
    local_1cb = 1;
    ::std::operator+(&local_168,&local_188,name);
    local_1cc = 1;
    ::std::operator+(&local_148,&local_168,", got ");
    local_1cd = 1;
    std::__cxx11::to_string(&local_1f0,local_28);
    ::std::operator+(&local_48,&local_148,&local_1f0);
  }
  else {
    std::__cxx11::to_string(&local_e8,expected);
    local_e9 = 1;
    ::std::operator+(&local_c8,"Expected exactly ",&local_e8);
    local_fd = 1;
    ::std::operator+(&local_a8,&local_c8," arguments to ");
    local_fe = 1;
    ::std::operator+(&local_88,&local_a8,name);
    local_ff = 1;
    ::std::operator+(&local_68,&local_88,", got ");
    local_100 = 1;
    std::__cxx11::to_string(&local_120,local_28);
    local_121 = 1;
    ::std::operator+(&local_48,&local_68,&local_120);
  }
  ArgumentMismatch(this,&local_48,ArgumentMismatch);
  ::std::__cxx11::string::~string((string *)&local_48);
  if (expected < 1) {
    ::std::__cxx11::string::~string((string *)&local_1f0);
  }
  if ((local_1cd & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_148);
  }
  if ((local_1cc & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_168);
  }
  if ((local_1cb & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_188);
  }
  if ((local_1ca & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_1a8);
  }
  if ((local_1c9 & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_1c8);
  }
  if ((local_121 & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_120);
  }
  if ((local_100 & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_68);
  }
  if ((local_ff & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_88);
  }
  if ((local_fe & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((local_fd & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((local_e9 & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_e8);
  }
  return;
}

Assistant:

ArgumentMismatch(std::string name, int expected, size_t recieved)
        : ArgumentMismatch(expected > 0 ? ("Expected exactly " + std::to_string(expected) + " arguments to " + name +
                                           ", got " + std::to_string(recieved))
                                        : ("Expected at least " + std::to_string(-expected) + " arguments to " + name +
                                           ", got " + std::to_string(recieved)),
                           ExitCodes::ArgumentMismatch) {}